

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::Zone::reset(Zone *this,bool releaseMemory)

{
  Block *__ptr;
  Block *pBVar1;
  Block *pBVar2;
  undefined1 *puVar3;
  
  pBVar2 = this->_block;
  puVar3 = Zone_zeroBlock;
  if (pBVar2 != (Block *)Zone_zeroBlock) {
    if (releaseMemory) {
      __ptr = pBVar2->next;
      do {
        pBVar1 = pBVar2->prev;
        free(pBVar2);
        pBVar2 = pBVar1;
      } while (pBVar1 != (Block *)0x0);
      while (__ptr != (Block *)0x0) {
        pBVar2 = __ptr->next;
        free(__ptr);
        __ptr = pBVar2;
      }
      this->_ptr = (uint8_t *)0x0;
      this->_end = (uint8_t *)0x0;
    }
    else {
      do {
        puVar3 = (undefined1 *)pBVar2;
        pBVar2 = ((Block *)puVar3)->prev;
      } while (((Block *)puVar3)->prev != (Block *)0x0);
      this->_ptr = ((Block *)puVar3)->data;
      this->_end = ((Block *)puVar3)->data + ((Block *)puVar3)->size;
    }
    this->_block = (Block *)puVar3;
  }
  return;
}

Assistant:

void Zone::reset(bool releaseMemory) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &Zone_zeroBlock)
    return;

  if (releaseMemory) {
    // Since cur can be in the middle of the double-linked list, we have to
    // traverse to both directions `prev` and `next` separately.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;
      Internal::releaseMemory(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      Internal::releaseMemory(cur);
      cur = next;
    }

    _ptr = nullptr;
    _end = nullptr;
    _block = const_cast<Zone::Block*>(&Zone_zeroBlock);
  }
  else {
    while (cur->prev)
      cur = cur->prev;

    _ptr = cur->data;
    _end = _ptr + cur->size;
    _block = cur;
  }
}